

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrinsic_geometry_interface.cpp
# Opt level: O1

void __thiscall
geometrycentral::surface::IntrinsicGeometryInterface::computeFaceGalerkinMassMatrix
          (IntrinsicGeometryInterface *this)

{
  SparseMatrix<double,_0,_int> *dst;
  size_t __n;
  SurfaceMesh *pSVar1;
  size_t sVar2;
  pointer puVar3;
  Index IVar4;
  Index IVar5;
  Index IVar6;
  Index IVar7;
  StorageIndex *pSVar8;
  StorageIndex *pSVar9;
  Scalar *pSVar10;
  StorageIndex *pSVar11;
  long lVar12;
  size_t sVar13;
  size_t sVar14;
  size_t i_1;
  ActualDstType actualDst;
  vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_> triplets;
  size_t i;
  undefined1 local_99;
  void *local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  SparseMatrix<double,_0,_int> local_80;
  undefined8 local_38;
  
  if ((this->super_BaseGeometryInterface).faceIndicesQ.super_DependentQuantity.computed == false) {
    if ((this->super_BaseGeometryInterface).faceIndicesQ.super_DependentQuantity.evaluateFunc.
        super__Function_base._M_manager == (_Manager_type)0x0) goto LAB_001885b6;
    (*(this->super_BaseGeometryInterface).faceIndicesQ.super_DependentQuantity.evaluateFunc.
      _M_invoker)((_Any_data *)
                  &(this->super_BaseGeometryInterface).faceIndicesQ.super_DependentQuantity.
                   evaluateFunc);
    (this->super_BaseGeometryInterface).faceIndicesQ.super_DependentQuantity.computed = true;
  }
  if ((this->faceAreasQ).super_DependentQuantity.computed == false) {
    if ((this->faceAreasQ).super_DependentQuantity.evaluateFunc.super__Function_base._M_manager ==
        (_Manager_type)0x0) {
LAB_001885b6:
      ::std::__throw_bad_function_call();
    }
    (*(this->faceAreasQ).super_DependentQuantity.evaluateFunc._M_invoker)
              ((_Any_data *)&(this->faceAreasQ).super_DependentQuantity.evaluateFunc);
    (this->faceAreasQ).super_DependentQuantity.computed = true;
  }
  local_98 = (void *)0x0;
  uStack_90 = 0;
  local_88 = 0;
  pSVar1 = (this->super_BaseGeometryInterface).mesh;
  sVar2 = pSVar1->nFacesFillCount;
  if ((sVar2 == 0) ||
     (puVar3 = (pSVar1->fHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start, *puVar3 != 0xffffffffffffffff)) {
    sVar13 = 0;
  }
  else {
    sVar14 = 0;
    do {
      sVar13 = sVar2;
      if (sVar2 - 1 == sVar14) break;
      sVar13 = sVar14 + 1;
      lVar12 = sVar14 + 1;
      sVar14 = sVar13;
    } while (puVar3[lVar12] == 0xffffffffffffffff);
  }
  if (sVar13 != sVar2) {
    do {
      local_80._0_8_ =
           (this->super_BaseGeometryInterface).faceIndices.data.
           super_PlainObjectBase<Eigen::Matrix<unsigned_long,__1,_1,_0,__1,_1>_>.m_storage.m_data
           [sVar13];
      ::std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
      emplace_back<unsigned_long&,unsigned_long&,double&>
                ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
                 &local_98,(unsigned_long *)&local_80,(unsigned_long *)&local_80,
                 (this->faceAreas).data.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                 sVar13);
      sVar14 = sVar13;
      do {
        sVar13 = sVar2;
        if (sVar2 - 1 == sVar14) break;
        sVar13 = sVar14 + 1;
        lVar12 = sVar14 + 1;
        sVar14 = sVar13;
      } while ((pSVar1->fHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar12] == 0xffffffffffffffff);
    } while (sVar13 != sVar2);
  }
  sVar2 = ((this->super_BaseGeometryInterface).mesh)->nFacesCount;
  local_80._0_8_ = local_80._0_8_ & 0xffffffffffffff00;
  local_80.m_outerSize = 0;
  local_80.m_innerSize = 0;
  local_80.m_outerIndex = (StorageIndex *)0x0;
  local_80.m_innerNonZeros = (StorageIndex *)0x0;
  local_80.m_data.m_values = (Scalar *)0x0;
  local_80.m_data.m_indices = (StorageIndex *)0x0;
  local_80.m_data.m_size = 0;
  local_80.m_data.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_0,_int>::resize(&local_80,sVar2,sVar2);
  dst = &this->faceGalerkinMassMatrix;
  if (local_80.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>.
      super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue == true) {
    IVar4 = (this->faceGalerkinMassMatrix).m_outerSize;
    IVar5 = (this->faceGalerkinMassMatrix).m_innerSize;
    (this->faceGalerkinMassMatrix).m_outerSize = local_80.m_outerSize;
    (this->faceGalerkinMassMatrix).m_innerSize = local_80.m_innerSize;
    pSVar8 = (this->faceGalerkinMassMatrix).m_outerIndex;
    pSVar9 = (this->faceGalerkinMassMatrix).m_innerNonZeros;
    pSVar10 = (this->faceGalerkinMassMatrix).m_data.m_values;
    pSVar11 = (this->faceGalerkinMassMatrix).m_data.m_indices;
    (this->faceGalerkinMassMatrix).m_outerIndex = local_80.m_outerIndex;
    (this->faceGalerkinMassMatrix).m_innerNonZeros = local_80.m_innerNonZeros;
    (this->faceGalerkinMassMatrix).m_data.m_values = local_80.m_data.m_values;
    (this->faceGalerkinMassMatrix).m_data.m_indices = local_80.m_data.m_indices;
    IVar6 = (this->faceGalerkinMassMatrix).m_data.m_size;
    IVar7 = (this->faceGalerkinMassMatrix).m_data.m_allocatedSize;
    (this->faceGalerkinMassMatrix).m_data.m_size = local_80.m_data.m_size;
    (this->faceGalerkinMassMatrix).m_data.m_allocatedSize = local_80.m_data.m_allocatedSize;
    local_80.m_outerSize = IVar4;
    local_80.m_innerSize = IVar5;
    local_80.m_outerIndex = pSVar8;
    local_80.m_innerNonZeros = pSVar9;
    local_80.m_data.m_values = pSVar10;
    local_80.m_data.m_indices = pSVar11;
    local_80.m_data.m_size = IVar6;
    local_80.m_data.m_allocatedSize = IVar7;
  }
  else if (dst != &local_80) {
    Eigen::SparseMatrix<double,0,int>::initAssignment<Eigen::SparseMatrix<double,0,int>>
              ((SparseMatrix<double,0,int> *)dst,&local_80);
    if (local_80.m_innerNonZeros == (StorageIndex *)0x0) {
      __n = (this->faceGalerkinMassMatrix).m_outerSize * 4 + 4;
      if (__n != 0) {
        memcpy((this->faceGalerkinMassMatrix).m_outerIndex,local_80.m_outerIndex,__n);
      }
      Eigen::internal::CompressedStorage<double,_int>::operator=
                (&(this->faceGalerkinMassMatrix).m_data,&local_80.m_data);
    }
    else {
      Eigen::internal::
      assign_sparse_to_sparse<Eigen::SparseMatrix<double,0,int>,Eigen::SparseMatrix<double,0,int>>
                (dst,&local_80);
    }
  }
  free(local_80.m_outerIndex);
  free(local_80.m_innerNonZeros);
  Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_80.m_data);
  local_80._0_8_ = local_98;
  local_38 = uStack_90;
  Eigen::internal::
  set_from_triplets<__gnu_cxx::__normal_iterator<Eigen::Triplet<double,int>*,std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>>,Eigen::SparseMatrix<double,0,int>,Eigen::internal::scalar_sum_op<double,double>>
            (&local_80,&local_38,dst,&local_99);
  if (local_98 != (void *)0x0) {
    operator_delete(local_98);
  }
  return;
}

Assistant:

void IntrinsicGeometryInterface::computeFaceGalerkinMassMatrix() {
  faceIndicesQ.ensureHave();
  faceAreasQ.ensureHave();

  std::vector<Eigen::Triplet<double>> triplets;
  for (Face f : mesh.faces()) {
    size_t i = faceIndices[f];
    triplets.emplace_back(i, i, faceAreas[f]);
  }

  faceGalerkinMassMatrix = Eigen::SparseMatrix<double>(mesh.nFaces(), mesh.nFaces());
  faceGalerkinMassMatrix.setFromTriplets(triplets.begin(), triplets.end());
}